

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply_randomizer_options.cpp
# Opt level: O3

void apply_randomizer_options(RandomizerOptions *options,RandomizerWorld *world)

{
  _Rb_tree_header *p_Var1;
  Item **ppIVar2;
  vector<Item_*,_std::allocator<Item_*>_> *this;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
  *pmVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ushort uVar5;
  char *__nptr;
  pointer pbVar6;
  WorldNode *pWVar7;
  pointer ppIVar8;
  WorldNode *to_node;
  uint8_t i_2;
  bool bVar9;
  byte bVar10;
  int iVar11;
  string_type *psVar12;
  reference pbVar13;
  int *piVar14;
  long lVar15;
  Item *pIVar16;
  mapped_type *ppIVar17;
  reference pvVar18;
  ulong uVar19;
  pointer pFVar20;
  string_type *psVar21;
  reference pbVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  WorldPath *pWVar24;
  mapped_type *ppWVar25;
  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_> _Var26;
  const_iterator cVar27;
  mapped_type *ppSVar28;
  SpawnLocation *spawn;
  _Base_ptr p_Var29;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar30;
  _Base_ptr p_Var31;
  Item **ppIVar32;
  uint8_t i;
  uint uVar33;
  mapped_type pIVar34;
  uint8_t bit;
  uint8_t uVar35;
  undefined8 uVar36;
  pointer ppIVar37;
  pointer ppWVar38;
  size_type sVar39;
  initializer_list<Flag> __l;
  initializer_list<Item_*> __l_00;
  const_iterator result_1;
  vector<Flag,_std::allocator<Flag>_> flags_to_add;
  size_type __dnew_5;
  size_type __dnew;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings_to_empty;
  Json game_strings_json;
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  __begin1;
  key_type_conflict local_5f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  undefined1 local_5d0 [48];
  _Alloc_hider local_5a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_590;
  _Alloc_hider local_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_570;
  vector<Item_*,_std::allocator<Item_*>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  vector<Item_*,_std::allocator<Item_*>_> local_528;
  vector<WorldNode_*,_std::allocator<WorldNode_*>_> local_508;
  _Any_data local_4e8;
  code *local_4d8;
  undefined8 uStack_4d0;
  vector<WorldNode_*,_std::allocator<WorldNode_*>_> local_4c8;
  vector<Item_*,_std::allocator<Item_*>_> local_4a8;
  pointer local_490;
  vector<Item_*,_std::allocator<Item_*>_> local_488;
  vector<Item_*,_std::allocator<Item_*>_> local_468;
  vector<WorldNode_*,_std::allocator<WorldNode_*>_> local_448;
  vector<Item_*,_std::allocator<Item_*>_> local_428;
  undefined1 local_410 [16];
  undefined1 auStack_400 [16];
  _Alloc_hider local_3f0;
  undefined2 local_3e8;
  undefined1 local_3e6;
  undefined **local_3e0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d0;
  _Alloc_hider local_3c0;
  undefined2 local_3b8;
  undefined1 local_3b6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0;
  undefined **local_3a0;
  undefined2 local_398;
  undefined1 local_396;
  undefined **local_390;
  undefined2 local_388;
  undefined1 local_386;
  undefined **local_380;
  undefined2 local_378;
  undefined1 local_376;
  undefined **local_370;
  undefined2 local_368;
  undefined1 local_366;
  undefined **local_360;
  undefined2 local_358;
  undefined1 local_356;
  undefined **local_350;
  undefined2 local_348;
  undefined1 local_346;
  undefined **local_340;
  undefined2 local_338;
  undefined1 local_336;
  undefined **local_330;
  undefined2 local_328;
  undefined1 local_326;
  undefined **local_320;
  undefined2 local_318;
  undefined1 local_316;
  undefined **local_310;
  undefined2 local_308;
  undefined1 local_306;
  undefined **local_300;
  undefined2 local_2f8;
  undefined1 local_2f6;
  undefined **local_2f0;
  undefined2 local_2e8;
  undefined1 local_2e6;
  undefined **local_2e0;
  undefined2 local_2d8;
  undefined1 local_2d6;
  undefined **local_2d0;
  undefined2 local_2c8;
  undefined1 local_2c6;
  undefined **local_2c0;
  undefined2 local_2b8;
  undefined1 local_2b6;
  undefined **local_2b0;
  undefined2 local_2a8;
  undefined1 local_2a6;
  undefined **local_2a0;
  undefined2 local_298;
  undefined1 local_296;
  undefined **local_290;
  undefined2 local_288;
  undefined1 local_286;
  undefined **local_280;
  undefined2 local_278;
  undefined1 local_276;
  undefined **local_270;
  undefined2 local_268;
  undefined1 local_266;
  undefined **local_260;
  undefined2 local_258;
  undefined1 local_256;
  undefined **local_250;
  undefined2 local_248;
  undefined1 local_246;
  undefined **local_240;
  undefined2 local_238;
  undefined1 local_236;
  undefined **local_230;
  undefined2 local_228;
  undefined1 local_226;
  undefined **local_220;
  undefined2 local_218;
  undefined1 local_216;
  undefined **local_210;
  undefined2 local_208;
  undefined1 local_206;
  undefined **local_200;
  undefined2 local_1f8;
  undefined1 local_1f6;
  undefined **local_1f0;
  undefined2 local_1e8;
  undefined1 local_1e6;
  undefined **local_1e0;
  undefined2 local_1d8;
  undefined1 local_1d6;
  undefined **local_1d0;
  undefined2 local_1c8;
  undefined1 local_1c6;
  undefined **local_1c0;
  undefined2 local_1b8;
  undefined1 local_1b6;
  undefined **local_1b0;
  undefined2 local_1a8;
  undefined1 local_1a6;
  undefined **local_1a0;
  undefined2 local_198;
  undefined1 local_196;
  undefined **local_190;
  undefined2 local_188;
  undefined1 local_186;
  undefined **local_180;
  undefined2 local_178;
  undefined1 local_176;
  undefined **local_170;
  undefined2 local_168;
  undefined1 local_166;
  undefined **local_160;
  undefined2 local_158;
  undefined1 local_156;
  undefined **local_150;
  undefined2 local_148;
  undefined1 local_146;
  undefined **local_140;
  undefined2 local_138;
  undefined1 local_136;
  undefined **local_130;
  undefined2 local_128;
  undefined1 local_126;
  undefined **local_120;
  undefined2 local_118;
  undefined1 local_116;
  undefined **local_110;
  undefined2 local_108;
  undefined1 local_106;
  undefined **local_100;
  undefined2 local_f8;
  undefined1 local_f6;
  undefined **local_f0;
  undefined2 local_e8;
  undefined1 local_e6;
  undefined **local_e0;
  undefined2 local_d8;
  undefined1 local_d6;
  undefined **local_d0;
  undefined2 local_c8;
  undefined1 local_c6;
  undefined **local_c0;
  undefined2 local_b8;
  undefined1 local_b6;
  undefined **local_b0;
  undefined2 local_a8;
  undefined1 local_a6;
  undefined **local_a0;
  undefined2 local_98;
  undefined1 local_96;
  undefined **local_90;
  undefined2 local_88;
  undefined1 local_86;
  undefined **local_80;
  undefined2 local_78;
  undefined1 local_76;
  undefined **local_70;
  undefined2 local_68;
  undefined1 local_66;
  undefined **local_60;
  undefined2 local_58;
  undefined1 local_56;
  undefined **local_50;
  undefined2 local_48;
  undefined1 local_46;
  undefined **local_40;
  undefined2 local_38;
  undefined1 local_36;
  
  (world->super_World)._starting_golds = options->_starting_gold;
  (world->super_World)._starting_life = options->_starting_life;
  local_410._0_8_ = &PTR_to_json_abi_cxx11__00262898;
  local_410._8_2_ = 0;
  local_410[10] = '\a';
  auStack_400._0_4_ = 0x262898;
  auStack_400._4_2_ = 0;
  auStack_400[6] = '\0';
  auStack_400[7] = '\0';
  auStack_400._8_2_ = 0;
  auStack_400[10] = 5;
  local_3f0._M_p = (pointer)&PTR_to_json_abi_cxx11__00262898;
  local_3e8 = 0;
  local_3e6 = 4;
  local_3e0[0] = &PTR_to_json_abi_cxx11__00262898;
  local_3e0[1]._0_2_ = 0;
  local_3e0[1]._2_1_ = '\0';
  local_3d0._M_allocated_capacity = (size_type)&PTR_to_json_abi_cxx11__00262898;
  local_3d0._8_2_ = 2;
  local_3d0._M_local_buf[10] = '\a';
  local_3c0._M_p = (pointer)&PTR_to_json_abi_cxx11__00262898;
  local_3b6 = 4;
  local_3b8 = 2;
  local_3b0._M_allocated_capacity = (size_type)&PTR_to_json_abi_cxx11__00262898;
  local_3b0._8_2_ = 2;
  local_3b0._M_local_buf[10] = '\x02';
  local_3a0 = &PTR_to_json_abi_cxx11__00262898;
  local_398 = 2;
  local_396 = 0;
  local_390 = &PTR_to_json_abi_cxx11__00262898;
  local_388 = 3;
  local_386 = 7;
  local_380 = &PTR_to_json_abi_cxx11__00262898;
  local_378 = 3;
  local_376 = 6;
  local_370 = &PTR_to_json_abi_cxx11__00262898;
  local_368 = 3;
  local_366 = 5;
  local_360 = &PTR_to_json_abi_cxx11__00262898;
  local_356 = 7;
  local_358 = 4;
  local_350 = &PTR_to_json_abi_cxx11__00262898;
  local_346 = 6;
  local_348 = 4;
  local_340 = &PTR_to_json_abi_cxx11__00262898;
  local_336 = 0;
  local_338 = 4;
  local_330 = &PTR_to_json_abi_cxx11__00262898;
  local_326 = 6;
  local_328 = 5;
  local_320 = &PTR_to_json_abi_cxx11__00262898;
  local_316 = 5;
  local_318 = 5;
  local_310 = &PTR_to_json_abi_cxx11__00262898;
  local_306 = 4;
  local_308 = 0x12;
  local_300 = &PTR_to_json_abi_cxx11__00262898;
  local_2f6 = 3;
  local_2f8 = 0x12;
  local_2f0 = &PTR_to_json_abi_cxx11__00262898;
  local_2e6 = 2;
  local_2e8 = 0x12;
  local_2e0 = &PTR_to_json_abi_cxx11__00262898;
  local_2d6 = 1;
  local_2d8 = 0x12;
  local_2d0 = &PTR_to_json_abi_cxx11__00262898;
  local_2c6 = 6;
  local_2c8 = 0x13;
  local_2c0 = &PTR_to_json_abi_cxx11__00262898;
  local_2b6 = 1;
  local_2b8 = 0x13;
  local_2b0 = &PTR_to_json_abi_cxx11__00262898;
  local_2a6 = 0;
  local_2a8 = 0x13;
  local_2a0 = &PTR_to_json_abi_cxx11__00262898;
  local_296 = 7;
  local_298 = 0x14;
  local_290 = &PTR_to_json_abi_cxx11__00262898;
  local_286 = 0;
  local_288 = 0x14;
  local_280 = &PTR_to_json_abi_cxx11__00262898;
  local_276 = 6;
  local_278 = 0x17;
  local_270 = &PTR_to_json_abi_cxx11__00262898;
  local_266 = 3;
  local_268 = 0x17;
  local_260 = &PTR_to_json_abi_cxx11__00262898;
  local_256 = 6;
  local_258 = 0x20;
  local_250 = &PTR_to_json_abi_cxx11__00262898;
  local_246 = 5;
  local_248 = 0x20;
  local_240 = &PTR_to_json_abi_cxx11__00262898;
  local_236 = 4;
  local_238 = 0x20;
  local_230 = &PTR_to_json_abi_cxx11__00262898;
  local_226 = 5;
  local_228 = 0x27;
  local_220 = &PTR_to_json_abi_cxx11__00262898;
  local_216 = 7;
  local_218 = 0x28;
  local_210 = &PTR_to_json_abi_cxx11__00262898;
  local_206 = 6;
  local_208 = 0x28;
  local_200 = &PTR_to_json_abi_cxx11__00262898;
  local_1f6 = 5;
  local_1f8 = 0x28;
  local_1f0 = &PTR_to_json_abi_cxx11__00262898;
  local_1e6 = 6;
  local_1e8 = 0x29;
  local_1e0 = &PTR_to_json_abi_cxx11__00262898;
  local_1d6 = 7;
  local_1d8 = 0x2a;
  local_1d0 = &PTR_to_json_abi_cxx11__00262898;
  local_1c6 = 0;
  local_1c8 = 0x2a;
  local_1c0 = &PTR_to_json_abi_cxx11__00262898;
  local_1b6 = 7;
  local_1b8 = 0x2b;
  local_1b0 = &PTR_to_json_abi_cxx11__00262898;
  local_1a6 = 1;
  local_1a8 = 0x2b;
  local_1a0 = &PTR_to_json_abi_cxx11__00262898;
  local_196 = 1;
  local_198 = 5;
  local_190 = &PTR_to_json_abi_cxx11__00262898;
  local_186 = 1;
  local_188 = 2;
  local_180 = &PTR_to_json_abi_cxx11__00262898;
  local_178 = 6;
  local_176 = 6;
  local_170 = &PTR_to_json_abi_cxx11__00262898;
  local_168 = 6;
  local_166 = 5;
  local_160 = &PTR_to_json_abi_cxx11__00262898;
  local_158 = 6;
  local_156 = 4;
  local_150 = &PTR_to_json_abi_cxx11__00262898;
  local_148 = 6;
  local_146 = 3;
  local_140 = &PTR_to_json_abi_cxx11__00262898;
  local_138 = 6;
  local_136 = 2;
  local_130 = &PTR_to_json_abi_cxx11__00262898;
  local_128 = 7;
  local_126 = 7;
  local_120 = &PTR_to_json_abi_cxx11__00262898;
  local_118 = 7;
  local_116 = 5;
  local_110 = &PTR_to_json_abi_cxx11__00262898;
  local_108 = 7;
  local_106 = 4;
  local_100 = &PTR_to_json_abi_cxx11__00262898;
  local_f8 = 7;
  local_f6 = 2;
  local_f0 = &PTR_to_json_abi_cxx11__00262898;
  local_e8 = 8;
  local_e6 = 7;
  local_e0 = &PTR_to_json_abi_cxx11__00262898;
  local_d8 = 8;
  local_d6 = 6;
  local_d0 = &PTR_to_json_abi_cxx11__00262898;
  local_c8 = 8;
  local_c6 = 5;
  local_c0 = &PTR_to_json_abi_cxx11__00262898;
  local_b8 = 8;
  local_b6 = 4;
  local_b0 = &PTR_to_json_abi_cxx11__00262898;
  local_a8 = 8;
  local_a6 = 3;
  local_a0 = &PTR_to_json_abi_cxx11__00262898;
  local_98 = 8;
  local_96 = 2;
  local_90 = &PTR_to_json_abi_cxx11__00262898;
  local_88 = 8;
  local_86 = 1;
  local_80 = &PTR_to_json_abi_cxx11__00262898;
  local_78 = 9;
  local_76 = 6;
  local_70 = &PTR_to_json_abi_cxx11__00262898;
  local_68 = 9;
  local_66 = 5;
  local_60 = &PTR_to_json_abi_cxx11__00262898;
  local_58 = 9;
  local_56 = 4;
  local_50 = &PTR_to_json_abi_cxx11__00262898;
  local_48 = 9;
  local_46 = 3;
  local_40 = &PTR_to_json_abi_cxx11__00262898;
  local_38 = 9;
  local_36 = 2;
  __l._M_len = 0x3e;
  __l._M_array = (iterator)local_410;
  std::vector<Flag,_std::allocator<Flag>_>::vector
            ((vector<Flag,_std::allocator<Flag>_> *)local_5d0,__l,(allocator_type *)&local_5f8);
  if (options->_all_trees_visited_at_start == true) {
    uVar35 = '\0';
    do {
      local_410._0_8_ = &PTR_to_json_abi_cxx11__00262898;
      local_410[10] = uVar35;
      local_410._8_2_ = 0x23;
      std::vector<Flag,_std::allocator<Flag>_>::emplace_back<Flag>
                ((vector<Flag,_std::allocator<Flag>_> *)local_5d0,(Flag *)local_410);
      uVar35 = uVar35 + '\x01';
    } while (uVar35 != '\b');
    local_410._0_8_ = &PTR_to_json_abi_cxx11__00262898;
    local_410._8_2_ = 0x25;
    local_410[10] = '\0';
    std::vector<Flag,_std::allocator<Flag>_>::emplace_back<Flag>
              ((vector<Flag,_std::allocator<Flag>_> *)local_5d0,(Flag *)local_410);
    local_410._0_8_ = &PTR_to_json_abi_cxx11__00262898;
    local_410._8_2_ = 0x25;
    local_410[10] = '\x01';
    std::vector<Flag,_std::allocator<Flag>_>::emplace_back<Flag>
              ((vector<Flag,_std::allocator<Flag>_> *)local_5d0,(Flag *)local_410);
  }
  if (options->_remove_gumi_boulder == true) {
    local_410._0_8_ = &PTR_to_json_abi_cxx11__00262898;
    local_410._8_2_ = 2;
    local_410[10] = '\x06';
    std::vector<Flag,_std::allocator<Flag>_>::emplace_back<Flag>
              ((vector<Flag,_std::allocator<Flag>_> *)local_5d0,(Flag *)local_410);
  }
  std::vector<Flag,std::allocator<Flag>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<Flag*,std::vector<Flag,std::allocator<Flag>>>>
            ((vector<Flag,std::allocator<Flag>> *)&(world->super_World)._starting_flags,
             (world->super_World)._starting_flags.super__Vector_base<Flag,_std::allocator<Flag>_>.
             _M_impl.super__Vector_impl_data._M_finish,local_5d0._0_8_,local_5d0._8_8_);
  if ((pointer)local_5d0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_5d0._0_8_,local_5d0._16_8_ - local_5d0._0_8_);
  }
  local_5d0._8_8_ =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *)0x0;
  local_5d0._16_8_ = (pointer)0x0;
  local_5d0._24_8_ = -0x8000000000000000;
  local_5d0._0_8_ = &options->_model_patch_items;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_begin((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)local_5d0);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::iteration_proxy_value
            ((iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_410,
             (iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_5d0);
  local_5f8._M_string_length = 0;
  local_5f8.field_2._M_allocated_capacity = 0;
  local_5f8.field_2._8_8_ = 0x8000000000000000;
  local_5f8._M_dataplus._M_p = (pointer)&options->_model_patch_items;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_end((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)&local_5f8);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::iteration_proxy_value
            ((iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_5d0,
             (iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)&local_5f8);
  p_Var1 = &(world->super_World)._items._M_t._M_impl.super__Rb_tree_header;
  while (bVar9 = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::
                 operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                           ((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)local_410,
                            (iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)local_5d0), !bVar9) {
    psVar12 = nlohmann::detail::
              iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::key((iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     *)local_410);
    pbVar13 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)local_410);
    __nptr = (psVar12->_M_dataplus)._M_p;
    piVar14 = __errno_location();
    iVar11 = *piVar14;
    *piVar14 = 0;
    lVar15 = strtol(__nptr,(char **)&local_5f8,10);
    if (local_5f8._M_dataplus._M_p == __nptr) {
      std::__throw_invalid_argument("stoi");
LAB_0017f949:
      std::__throw_out_of_range("stoi");
    }
    if ((lVar15 - 0x80000000U < 0xffffffff00000000) || (*piVar14 == 0x22)) goto LAB_0017f949;
    if (*piVar14 == 0) {
      *piVar14 = iVar11;
    }
    p_Var29 = (world->super_World)._items._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    bVar10 = (byte)lVar15;
    p_Var31 = &p_Var1->_M_header;
    if (p_Var29 == (_Base_ptr)0x0) {
LAB_0017dc78:
      pIVar16 = Item::from_json(bVar10,pbVar13);
      World::add_item(&world->super_World,pIVar16);
    }
    else {
      do {
        bVar9 = (byte)*(size_t *)(p_Var29 + 1) < bVar10;
        if (!bVar9) {
          p_Var31 = p_Var29;
        }
        p_Var29 = (&p_Var29->_M_left)[bVar9];
      } while (p_Var29 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var31 == p_Var1) ||
         (bVar10 < (byte)((_Rb_tree_header *)p_Var31)->_M_node_count)) goto LAB_0017dc78;
      local_5f8._M_dataplus._M_p._0_1_ = bVar10;
      ppIVar17 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,(key_type_conflict *)&local_5f8);
      Item::apply_json(*ppIVar17,pbVar13);
    }
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_410);
    local_3f0._M_p = local_3f0._M_p + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_p != &local_3b0) {
    operator_delete(local_3c0._M_p,local_3b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0[0] != &local_3d0) {
    operator_delete(local_3e0[0],local_3d0._M_allocated_capacity + 1);
  }
  bVar10 = options->_jewel_count;
  if (bVar10 < 6) {
    if (bVar10 == 5) {
      local_410[0] = 0x22;
      ppIVar17 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      auStack_400._0_4_ = 0x6c6c6559;
      auStack_400._4_2_ = 0x776f;
      auStack_400[6] = ' ';
      auStack_400[7] = 'J';
      auStack_400._8_2_ = 0x7765;
      auStack_400[10] = 0x65;
      auStack_400[0xb] = 0x6c;
      local_410._8_2_ = 0xc;
      local_410[10] = '\0';
      local_410._11_5_ = 0;
      auStack_400[0xc] = 0;
      local_410._0_8_ = (pointer)auStack_400;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&(*ppIVar17)->_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
      if ((pointer)local_410._0_8_ != (pointer)auStack_400) {
        operator_delete((void *)local_410._0_8_,
                        CONCAT17(auStack_400[7],
                                 CONCAT16(auStack_400[6],
                                          CONCAT24(auStack_400._4_2_,auStack_400._0_4_))) + 1);
      }
      local_410[0] = '\"';
      ppIVar17 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      (**(*ppIVar17)->_vptr_Item)(*ppIVar17,500);
      local_410[0] = 0x21;
      ppIVar17 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      (*ppIVar17)->_max_quantity = '\x01';
      bVar10 = options->_jewel_count;
    }
    if (3 < bVar10) {
      local_410[0] = 0x21;
      ppIVar17 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      auStack_400._0_4_ = 0x65756c42;
      auStack_400._4_2_ = 0x4a20;
      auStack_400[6] = 'e';
      auStack_400[7] = 'w';
      auStack_400._8_2_ = 0x6c65;
      local_410._8_2_ = 10;
      local_410[10] = '\0';
      local_410._11_5_ = 0;
      auStack_400[10] = 0;
      local_410._0_8_ = (pointer)auStack_400;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&(*ppIVar17)->_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
      if ((pointer)local_410._0_8_ != (pointer)auStack_400) {
        operator_delete((void *)local_410._0_8_,
                        CONCAT17(auStack_400[7],
                                 CONCAT16(auStack_400[6],
                                          CONCAT24(auStack_400._4_2_,auStack_400._0_4_))) + 1);
      }
      local_410[0] = '!';
      ppIVar17 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      (**(*ppIVar17)->_vptr_Item)(*ppIVar17,500);
      local_410[0] = 0x21;
      ppIVar17 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      (*ppIVar17)->_max_quantity = '\x01';
      bVar10 = options->_jewel_count;
    }
    if (2 < bVar10) {
      local_410[0] = 0x34;
      ppIVar17 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      auStack_400._0_4_ = 0x65657247;
      auStack_400._4_2_ = 0x206e;
      auStack_400[6] = 'J';
      auStack_400[7] = 'e';
      auStack_400._8_2_ = 0x6577;
      auStack_400[10] = 0x6c;
      local_410._8_2_ = 0xb;
      local_410[10] = '\0';
      local_410._11_5_ = 0;
      auStack_400[0xb] = 0;
      local_410._0_8_ = (pointer)auStack_400;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&(*ppIVar17)->_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
      if ((pointer)local_410._0_8_ != (pointer)auStack_400) {
        operator_delete((void *)local_410._0_8_,
                        CONCAT17(auStack_400[7],
                                 CONCAT16(auStack_400[6],
                                          CONCAT24(auStack_400._4_2_,auStack_400._0_4_))) + 1);
      }
      local_410[0] = '4';
      ppIVar17 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      (**(*ppIVar17)->_vptr_Item)(*ppIVar17,500);
      local_410[0] = 0x34;
      ppIVar17 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      pIVar34 = *ppIVar17;
      uVar35 = '\x01';
      goto LAB_0017e01f;
    }
  }
  else {
    local_410[0] = 0x28;
    ppIVar17 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    pIVar34 = *ppIVar17;
    auStack_400._0_4_ = 0x617a614b;
    auStack_400._4_2_ = 0x746c;
    auStack_400[6] = ' ';
    auStack_400[7] = 'J';
    auStack_400._8_2_ = 0x7765;
    auStack_400[10] = 0x65;
    auStack_400[0xb] = 0x6c;
    local_410._8_2_ = 0xc;
    local_410[10] = '\0';
    local_410._11_5_ = 0;
    auStack_400[0xc] = 0;
    local_410._0_8_ = (pointer)auStack_400;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&pIVar34->_name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
    if ((pointer)local_410._0_8_ != (pointer)auStack_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(auStack_400[7],
                               CONCAT16(auStack_400[6],CONCAT24(auStack_400._4_2_,auStack_400._0_4_)
                                       )) + 1);
    }
    uVar35 = options->_jewel_count;
LAB_0017e01f:
    pIVar34->_max_quantity = uVar35;
  }
  lVar15 = 0;
  do {
    local_5f9 = (key_type_conflict)lVar15;
    ppIVar17 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,&local_5f9);
    bVar10 = (options->_starting_items)._M_elems[lVar15];
    if (8 < bVar10) {
      bVar10 = 9;
    }
    (*ppIVar17)->_starting_quantity = bVar10;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x3e);
  if (options->_use_armor_upgrades != false) {
    local_410[0] = '\t';
    ppIVar17 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    (**(*ppIVar17)->_vptr_Item)(*ppIVar17,0xfa);
    local_410[0] = '\n';
    ppIVar17 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    (**(*ppIVar17)->_vptr_Item)(*ppIVar17,0xfa);
    local_410[0] = '\v';
    ppIVar17 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    (**(*ppIVar17)->_vptr_Item)(*ppIVar17,0xfa);
    local_410[0] = 0xc;
    ppIVar17 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    (**(*ppIVar17)->_vptr_Item)(*ppIVar17,0xfa);
  }
  if (options->_consumable_record_book == true) {
    local_410[0] = '#';
    ppIVar17 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    (*ppIVar17)->_max_quantity = '\t';
    local_410[0] = '#';
    ppIVar17 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    uVar5 = (*ppIVar17)->_gold_value;
    local_410[0] = 0x23;
    ppIVar17 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    (**(*ppIVar17)->_vptr_Item)(*ppIVar17,(ulong)(uVar5 / 5));
  }
  if (options->_consumable_spell_book == true) {
    local_410[0] = '$';
    ppIVar17 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    (*ppIVar17)->_max_quantity = '\t';
    local_410[0] = '$';
    ppIVar17 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    uVar5 = (*ppIVar17)->_gold_value;
    local_410[0] = 0x24;
    ppIVar17 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,local_410);
    (**(*ppIVar17)->_vptr_Item)(*ppIVar17,(ulong)(uVar5 / 5));
  }
  local_4e8._M_unused._M_object = (void *)0x0;
  local_4e8._8_8_ = 0;
  local_4d8 = (code *)0x0;
  uStack_4d0 = 0;
  nlohmann::
  basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<unsigned_char_const(&)[15116]>
            ((basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_508,
             (uchar (*) [15116])
             "{\n    \"emptiedIndices\": [\n        // Debug menu strings\n        \"1d\", \"1e\", \"1f\", \"20\",\n        \"23\", \"24\", \"25\", \"26\", \"27\", \"28\", \"29\", \"2a\", \"2b\", \"2c\", \"2d\", \"2e\", \"2f\", \n              \"30\", \"31\", \"32\", \"33\", \"34\", \"35\", \"36\", \"37\", \"38\", \"39\", \"3a\", \"3b\", \n              \"3c\", \"3d\", \"3e\", \"3f\", \"40\", \"41\", \"42\", \"43\", \"44\", \"45\", \"46\", \"47\", \n              \"48\", \"49\", \"4a\", \"4b\", \"4c\", \"4d\", \n        // Unreachable Massan elder dialogues\n        \"148\", \"149\",\n        // Unreachable Fara dialogues\n        \"14f\", \"150\",\n        // Pockets boulder dialogue\n        \"180\", \"181\", \"182\", \"183\", \"184\", \"185\", \"186\", \"187\", \"188\", \"189\", \"18a\", \"18b\", \n        \"18c\", \"18d\",\n        // Unreachable Prospero dialogues\n        \"1c6\", \"1c7\", \"1c8\", \"1c9\", \"1ca\", \"1cb\", \"1cc\", \"1cd\", \"1ce\", \"1cf\", \"1d0\", \"1d1\",\n               \"1d2\", \"1d3\", \"1d4\", \"1d5\", \"1d6\", \"1d7\", \"1d8\", \"1d9\",\n        // Arthur gift cutscene\n        \"497\", \"498\", \"499\", \"49a\", \"49b\",\n        // Fara discovering Nigel fallen from waterfall cutscene\n        \"52e\", \"52f\", \"530\", \"531\", \"532\", \"533\", \"534\",\n        // Cutscene spying on Gumi ritual\n        \"54d\", \"54e\", \"54f\", \"550\", \"551\",\n        // Kayla raft cutscene\n        \"572\", \"573\", \"574\", \"575\", \"576\", \"577\", \"578\", \n        // Lithograph cutscene\n        \"579\", \"57a\", \"57b\", \"57c\", \"57d\", \"57e\", \"57f\", \"580\", \"581\", \"582\", \"583\", \"584\", \"585\", \n               \"586\", \"587\", \"588\", \"589\", \"58a\", \"58b\", \"58c\", \"58d\", \"58e\", \"58f\", \"590\", \"591\", \n               \"592\", \n        // Mercator gate guards\n        \"5a0\", \"5a1\", \"5a2\", \"5a3\", \"5a4\", \"5a5\", \"5a6\", \"5a7\", \"5a8\", \"5a9\",\n        // Fahl intermediary dialogues\n        \"5b6\", \"5b7\", \"5b8\", \"5b9\", \"5ba\", \"5bb\", \"5bc\", \"5bd\", \"5be\", \"5bf\", \"5c0\", \"5c1\", \n               \"5c2\", \"5c3\",\n        // Mercator castle backdoor cutscene\n        \"5e1\", \"5e2\", \"5e3\", \"5e4\", \"5e5\", \"5e6\", \"5e7\", \"5e8\", \"5e9\", \"5ea\", \"5eb\", \"5ec\", \"5ed\", \n        // Mercator cutscenes (Madame Yard & castle)\n        \"5f6\", \"5f7\", \"5f8\", \"5f9\", \"5fa\", \"5fb\", \"5fc\", \"5fd\", \"5fe\",..." /* TRUNCATED STRING LITERAL */
             ,(parser_callback_t *)&local_4e8,true,true);
  if (local_4d8 != (code *)0x0) {
    (*local_4d8)(&local_4e8,&local_4e8,3);
  }
  auStack_400._0_4_ = 0x74706d65;
  auStack_400._4_2_ = 0x6569;
  auStack_400[6] = 'd';
  auStack_400[7] = 'I';
  auStack_400._8_2_ = 0x646e;
  auStack_400[10] = 0x69;
  auStack_400[0xb] = 99;
  auStack_400[0xc] = 0x65;
  auStack_400[0xd] = 0x73;
  local_410._8_8_ =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *)0xe;
  auStack_400[0xe] = 0;
  local_410._0_8_ = (pointer)auStack_400;
  pvVar18 = nlohmann::
            basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::at((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&local_508,(key_type *)local_410);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  get_impl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
            (&local_528,pvVar18);
  if ((pointer)local_410._0_8_ != (pointer)auStack_400) {
    operator_delete((void *)local_410._0_8_,
                    CONCAT17(auStack_400[7],
                             CONCAT16(auStack_400[6],CONCAT24(auStack_400._4_2_,auStack_400._0_4_)))
                    + 1);
  }
  ppIVar8 = local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppIVar37 = local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar14 = __errno_location();
    do {
      pIVar16 = *ppIVar37;
      iVar11 = *piVar14;
      *piVar14 = 0;
      lVar15 = strtol((char *)pIVar16,(char **)local_410,0x10);
      if ((Item *)local_410._0_8_ == pIVar16) {
        std::__throw_invalid_argument("stoi");
LAB_0017f979:
        std::__throw_out_of_range("stoi");
      }
      if ((lVar15 - 0x80000000U < 0xffffffff00000000) || (*piVar14 == 0x22)) goto LAB_0017f979;
      if (*piVar14 == 0) {
        *piVar14 = iVar11;
      }
      pbVar6 = (world->super_World)._game_strings.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar19 = (ulong)(((uint)lVar15 & 0xffff) << 5);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&(pbVar6->_M_dataplus)._M_p + uVar19),0,
                 *(size_type *)((long)&pbVar6->_M_string_length + uVar19),"",0);
      ppIVar37 = ppIVar37 + 4;
    } while (ppIVar37 != ppIVar8);
  }
  auStack_400._0_4_ = 0x63746170;
  auStack_400._4_2_ = 0x6568;
  auStack_400[6] = 's';
  local_410._8_8_ =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *)0x7;
  auStack_400[7] = '\0';
  local_410._0_8_ = (pointer)auStack_400;
  pFVar20 = (pointer)nlohmann::
                     basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     ::at((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           *)&local_508,(key_type *)local_410);
  if ((pointer)local_410._0_8_ != (pointer)auStack_400) {
    operator_delete((void *)local_410._0_8_,
                    CONCAT17(auStack_400[7],
                             CONCAT16(auStack_400[6],CONCAT24(auStack_400._4_2_,auStack_400._0_4_)))
                    + 1);
  }
  local_5d0._8_8_ =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *)0x0;
  local_5d0._16_8_ = (pointer)0x0;
  local_5d0._24_8_ = -0x8000000000000000;
  local_5d0._0_8_ = pFVar20;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_begin((iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)local_5d0);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::iteration_proxy_value
            ((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_410,
             (iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_5d0);
  local_5f8._M_string_length = 0;
  local_5f8.field_2._M_allocated_capacity = 0;
  local_5f8.field_2._8_8_ = 0x8000000000000000;
  local_5f8._M_dataplus._M_p = (pointer)pFVar20;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_end((iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)&local_5f8);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::iteration_proxy_value
            ((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_5d0,
             (iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)&local_5f8);
  while( true ) {
    bVar9 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      ((iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_410,
                       (iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        *)local_5d0);
    if (bVar9) break;
    psVar21 = nlohmann::detail::
              iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::key((iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     *)local_410);
    pbVar22 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*((iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)local_410);
    pFVar20 = (pointer)(psVar21->_M_dataplus)._M_p;
    piVar14 = __errno_location();
    iVar11 = *piVar14;
    *piVar14 = 0;
    lVar15 = strtol((char *)pFVar20,(char **)&local_5f8,0x10);
    if ((pointer)local_5f8._M_dataplus._M_p == pFVar20) {
      std::__throw_invalid_argument("stoi");
LAB_0017f961:
      std::__throw_out_of_range("stoi");
    }
    if ((lVar15 - 0x80000000U < 0xffffffff00000000) || (*piVar14 == 0x22)) goto LAB_0017f961;
    if (*piVar14 == 0) {
      *piVar14 = iVar11;
    }
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_5f8,pbVar22);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(((world->super_World)._game_strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
               (ulong)(((uint)lVar15 & 0xffff) << 5)),&local_5f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
      operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
    }
    nlohmann::detail::
    iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++((iter_impl<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_410);
    local_3f0._M_p = local_3f0._M_p + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_p != &local_3b0) {
    operator_delete(local_3c0._M_p,local_3b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0[0] != &local_3d0) {
    operator_delete(local_3e0[0],local_3d0._M_allocated_capacity + 1);
  }
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  local_548._M_dataplus._M_p = (pointer)0x18;
  local_5f8._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_5f8,(size_type *)&local_548,0);
  paVar4 = &local_548.field_2;
  local_5f8.field_2._M_allocated_capacity = (size_type)local_548._M_dataplus._M_p;
  builtin_strncpy(local_5f8._M_dataplus._M_p,"Only the bearers of the ",0x18);
  local_5f8._M_string_length = (size_type)local_548._M_dataplus._M_p;
  local_5f8._M_dataplus._M_p[local_548._M_dataplus._M_p] = '\0';
  bVar10 = options->_jewel_count;
  sVar39 = 1;
  if (9 < bVar10) {
    sVar39 = (size_type)(3 - (bVar10 < 100));
  }
  local_548._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_548,sVar39,'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_548._M_dataplus._M_p,(uint)sVar39,(uint)bVar10);
  uVar36 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    uVar36 = local_5f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar36 < (pointer)(local_5f8._M_string_length + local_548._M_string_length)) {
    uVar36 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548._M_dataplus._M_p != paVar4) {
      uVar36 = local_548.field_2._M_allocated_capacity;
    }
    if ((pointer)(local_5f8._M_string_length + local_548._M_string_length) <= (ulong)uVar36) {
      pbVar23 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace(&local_548,0,0,local_5f8._M_dataplus._M_p,local_5f8._M_string_length);
      goto LAB_0017e6e1;
    }
  }
  pbVar23 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_5f8,local_548._M_dataplus._M_p,local_548._M_string_length);
LAB_0017e6e1:
  local_5d0._0_8_ = (pbVar23->_M_dataplus)._M_p;
  paVar30 = &pbVar23->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._0_8_ == paVar30) {
    local_5d0._16_8_ = paVar30->_M_allocated_capacity;
    local_5d0._24_8_ = *(difference_type *)((long)&pbVar23->field_2 + 8);
    local_5d0._0_8_ = (pointer)(local_5d0 + 0x10);
  }
  else {
    local_5d0._16_8_ = paVar30->_M_allocated_capacity;
  }
  local_5d0._8_8_ = pbVar23->_M_string_length;
  (pbVar23->_M_dataplus)._M_p = (pointer)paVar30;
  pbVar23->_M_string_length = 0;
  paVar30->_M_local_buf[0] = '\0';
  pbVar23 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5d0," jewels\n are worthy of entering\n King Nole\'s domain...\x1e");
  local_410._0_8_ = (pbVar23->_M_dataplus)._M_p;
  paVar30 = &pbVar23->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._0_8_ == paVar30) {
    sVar39 = paVar30->_M_allocated_capacity;
    uVar36 = *(undefined8 *)((long)&pbVar23->field_2 + 8);
    auStack_400._0_4_ = (undefined4)sVar39;
    auStack_400._4_2_ = (undefined2)(sVar39 >> 0x20);
    auStack_400[6] = (undefined1)(sVar39 >> 0x30);
    auStack_400[7] = (undefined1)(sVar39 >> 0x38);
    auStack_400._8_2_ = (undefined2)uVar36;
    auStack_400[10] = (undefined1)((ulong)uVar36 >> 0x10);
    auStack_400[0xb] = (undefined1)((ulong)uVar36 >> 0x18);
    auStack_400[0xc] = (undefined1)((ulong)uVar36 >> 0x20);
    auStack_400[0xd] = (undefined1)((ulong)uVar36 >> 0x28);
    auStack_400[0xe] = (undefined1)((ulong)uVar36 >> 0x30);
    auStack_400[0xf] = (undefined1)((ulong)uVar36 >> 0x38);
    local_410._0_8_ = (mapped_type)auStack_400;
  }
  else {
    sVar39 = paVar30->_M_allocated_capacity;
    auStack_400._0_4_ = (undefined4)sVar39;
    auStack_400._4_2_ = (undefined2)(sVar39 >> 0x20);
    auStack_400[6] = (undefined1)(sVar39 >> 0x30);
    auStack_400[7] = (undefined1)(sVar39 >> 0x38);
  }
  local_410._8_8_ = pbVar23->_M_string_length;
  (pbVar23->_M_dataplus)._M_p = (pointer)paVar30;
  pbVar23->_M_string_length = 0;
  (pbVar23->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((world->super_World)._game_strings.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 0x22,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
  if ((mapped_type)local_410._0_8_ != (mapped_type)auStack_400) {
    operator_delete((void *)local_410._0_8_,
                    CONCAT17(auStack_400[7],
                             CONCAT16(auStack_400[6],CONCAT24(auStack_400._4_2_,auStack_400._0_4_)))
                    + 1);
  }
  if ((pointer)local_5d0._0_8_ != (pointer)(local_5d0 + 0x10)) {
    operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != paVar4) {
    operator_delete(local_548._M_dataplus._M_p,(ulong)(local_548.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_528);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)&local_508);
  if (options->_remove_gumi_boulder == true) {
    pWVar24 = (WorldPath *)operator_new(0x60);
    local_5d0._0_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x10;
    local_410._0_8_ = (mapped_type)auStack_400;
    local_410._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410,
                    (size_type *)local_5d0,0);
    auStack_400._0_4_ = (undefined4)local_5d0._0_8_;
    auStack_400._4_2_ = SUB82(local_5d0._0_8_,4);
    auStack_400[6] = SUB81(local_5d0._0_8_,6);
    auStack_400[7] = SUB81(local_5d0._0_8_,7);
    ((mapped_type)local_410._0_8_)->_vptr_Item = (_func_int **)0x75675f6574756f72;
    ((mapped_type)local_410._0_8_)->_id = 'm';
    ((mapped_type)local_410._0_8_)->field_0x9 = 'i';
    ((mapped_type)local_410._0_8_)->field_0xa = '_';
    ((mapped_type)local_410._0_8_)->field_0xb = 'r';
    ((mapped_type)local_410._0_8_)->field_0xc = 'y';
    ((mapped_type)local_410._0_8_)->field_0xd = 'u';
    ((mapped_type)local_410._0_8_)->field_0xe = 'm';
    ((mapped_type)local_410._0_8_)->field_0xf = 'a';
    local_410._8_8_ = local_5d0._0_8_;
    *(char *)((long)&((mapped_type)local_410._0_8_)->_vptr_Item + local_5d0._0_8_) = '\0';
    ppWVar25 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(&world->_nodes,(key_type *)local_410);
    pWVar7 = *ppWVar25;
    local_5d0._0_8_ = local_5d0 + 0x10;
    local_5d0._8_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x4;
    local_5d0._16_5_ = 0x696d7567;
    ppWVar25 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(&world->_nodes,(key_type *)local_5d0);
    local_5f8.field_2._M_allocated_capacity = 0;
    local_5f8._M_dataplus._M_p = (char *)0x0;
    local_5f8._M_string_length = 0;
    local_4e8._M_unused._M_object = (void *)0x0;
    local_4e8._8_8_ = 0;
    local_4d8 = (code *)0x0;
    local_548._M_dataplus._M_p = (pointer)0x0;
    local_548._M_string_length = 0;
    local_548.field_2._M_allocated_capacity = 0;
    WorldPath::WorldPath
              (pWVar24,pWVar7,*ppWVar25,1,(vector<Item_*,_std::allocator<Item_*>_> *)&local_5f8,
               (vector<WorldNode_*,_std::allocator<WorldNode_*>_> *)&local_4e8,
               (vector<Item_*,_std::allocator<Item_*>_> *)&local_548);
    RandomizerWorld::add_path(world,pWVar24);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_548._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_548._M_dataplus._M_p,
                      local_548.field_2._M_allocated_capacity - (long)local_548._M_dataplus._M_p);
    }
    if (local_4e8._M_unused._M_object != (void *)0x0) {
      operator_delete(local_4e8._M_unused._M_object,(long)local_4d8 - local_4e8._0_8_);
    }
    if (local_5f8._M_dataplus._M_p != (char *)0x0) {
      operator_delete(local_5f8._M_dataplus._M_p,
                      local_5f8.field_2._M_allocated_capacity - (long)local_5f8._M_dataplus._M_p);
    }
    if ((pointer)local_5d0._0_8_ != (pointer)(local_5d0 + 0x10)) {
      operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
    }
    if ((mapped_type)local_410._0_8_ != (mapped_type)auStack_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(auStack_400[7],
                               CONCAT16(auStack_400[6],CONCAT24(auStack_400._4_2_,auStack_400._0_4_)
                                       )) + 1);
    }
  }
  if (options->_enemy_jumping_in_logic == true) {
    pWVar24 = (WorldPath *)operator_new(0x60);
    local_5d0._0_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x11;
    local_410._0_8_ = (pointer)auStack_400;
    local_410._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410,
                    (size_type *)local_5d0,0);
    auStack_400._0_4_ = (undefined4)local_5d0._0_8_;
    auStack_400._4_2_ = SUB82(local_5d0._0_8_,4);
    auStack_400[6] = SUB81(local_5d0._0_8_,6);
    auStack_400[7] = SUB81(local_5d0._0_8_,7);
    ((pointer)local_410._0_8_)->m_type = 'r';
    ((pointer)local_410._0_8_)->field_0x1 = 'o';
    ((pointer)local_410._0_8_)->field_0x2 = 'u';
    ((pointer)local_410._0_8_)->field_0x3 = 't';
    ((pointer)local_410._0_8_)->field_0x4 = 'e';
    ((pointer)local_410._0_8_)->field_0x5 = '_';
    ((pointer)local_410._0_8_)->field_0x6 = 'l';
    ((pointer)local_410._0_8_)->field_0x7 = 'a';
    ((pointer)local_410._0_8_)->m_value = (json_value)0x6e697268735f656b;
    ((pointer)(local_410._0_8_ + 0x10))->m_type = 0x65;
    local_410._8_8_ = local_5d0._0_8_;
    (&((pointer)local_410._0_8_)->m_type)[local_5d0._0_8_] = null;
    pmVar3 = &world->_nodes;
    ppWVar25 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar3,(key_type *)local_410);
    pWVar7 = *ppWVar25;
    local_5d0._0_8_ = local_5d0 + 0x10;
    local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x17;
    local_5d0._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0,
                    (size_type *)&local_528,0);
    local_5d0._16_8_ =
         local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    ((pointer)local_5d0._0_8_)->_vptr_Flag = (_func_int **)0x616c5f6574756f72;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->byte = 0x6e697268735f656b;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->field_0xf = 0x6666696c635f656e;
    local_5d0._8_8_ =
         local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(char *)((long)&((pointer)local_5d0._0_8_)->_vptr_Flag +
             (long)local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                   super__Vector_impl_data._M_start) = '\0';
    ppWVar25 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar3,(key_type *)local_5d0);
    local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_508.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_508.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_508.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_428.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_428.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_428.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    WorldPath::WorldPath(pWVar24,pWVar7,*ppWVar25,1,&local_528,&local_508,&local_428);
    RandomizerWorld::add_path(world,pWVar24);
    pFVar20 = (pointer)(local_5d0 + 0x10);
    if (local_428.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_428.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_428.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_428.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_508.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_508.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_508.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_508.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_528.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((pointer)local_5d0._0_8_ != pFVar20) {
      operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
    }
    if ((pointer)local_410._0_8_ != (pointer)auStack_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(auStack_400[7],
                               CONCAT16(auStack_400[6],CONCAT24(auStack_400._4_2_,auStack_400._0_4_)
                                       )) + 1);
    }
    local_5d0._0_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x10;
    local_410._0_8_ = (pointer)auStack_400;
    local_410._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410,
                    (size_type *)local_5d0,0);
    auStack_400._0_4_ = (undefined4)local_5d0._0_8_;
    auStack_400._4_2_ = SUB82(local_5d0._0_8_,4);
    auStack_400[6] = SUB81(local_5d0._0_8_,6);
    auStack_400[7] = SUB81(local_5d0._0_8_,7);
    ((mapped_type)local_410._0_8_)->_vptr_Item = (_func_int **)0x65776f745f72696d;
    ((mapped_type)local_410._0_8_)->_id = 'r';
    ((mapped_type)local_410._0_8_)->field_0x9 = '_';
    ((mapped_type)local_410._0_8_)->field_0xa = 's';
    ((mapped_type)local_410._0_8_)->field_0xb = 'e';
    ((mapped_type)local_410._0_8_)->field_0xc = 'c';
    ((mapped_type)local_410._0_8_)->field_0xd = 't';
    ((mapped_type)local_410._0_8_)->field_0xe = 'o';
    ((mapped_type)local_410._0_8_)->field_0xf = 'r';
    local_410._8_8_ = local_5d0._0_8_;
    *(char *)((long)&((mapped_type)local_410._0_8_)->_vptr_Item + local_5d0._0_8_) = '\0';
    ppWVar25 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar3,(key_type *)local_410);
    pWVar7 = *ppWVar25;
    local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x1b;
    local_5d0._0_8_ = pFVar20;
    local_5d0._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0,
                    (size_type *)&local_560,0);
    local_5d0._16_8_ =
         local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->field_0xb = 0x72745f726f746365;
    builtin_strncpy((char *)((long)&((pointer)(local_5d0._0_8_ + 0x10))->_vptr_Flag + 3),"ee_ledge",
                    8);
    ((pointer)local_5d0._0_8_)->_vptr_Flag = (_func_int **)0x65776f745f72696d;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->byte = 0x726f746365735f72;
    local_5d0._8_8_ =
         local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(char *)((long)&((pointer)local_5d0._0_8_)->_vptr_Flag +
             (long)local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                   super__Vector_impl_data._M_start) = '\0';
    ppWVar25 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar3,(key_type *)local_5d0);
    pWVar24 = RandomizerWorld::path(world,pWVar7,*ppWVar25);
    ppIVar37 = (pWVar24->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((pWVar24->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar37) {
      (pWVar24->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar37;
    }
    if ((pointer)local_5d0._0_8_ != pFVar20) {
      operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
    }
    if ((mapped_type)local_410._0_8_ != (mapped_type)auStack_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(auStack_400[7],
                               CONCAT16(auStack_400[6],CONCAT24(auStack_400._4_2_,auStack_400._0_4_)
                                       )) + 1);
    }
  }
  pFVar20 = (pointer)(local_5d0 + 0x10);
  if (options->_tree_cutting_glitch_in_logic == true) {
    local_5d0._0_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x10;
    local_410._0_8_ = (pointer)auStack_400;
    local_410._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410,
                    (size_type *)local_5d0,0);
    auStack_400._0_4_ = (undefined4)local_5d0._0_8_;
    auStack_400._4_2_ = SUB82(local_5d0._0_8_,4);
    auStack_400[6] = SUB81(local_5d0._0_8_,6);
    auStack_400[7] = SUB81(local_5d0._0_8_,7);
    ((pointer)local_410._0_8_)->m_type = 'm';
    ((pointer)local_410._0_8_)->field_0x1 = 'i';
    ((pointer)local_410._0_8_)->field_0x2 = 'r';
    ((pointer)local_410._0_8_)->field_0x3 = '_';
    ((pointer)local_410._0_8_)->field_0x4 = 't';
    ((pointer)local_410._0_8_)->field_0x5 = 'o';
    ((pointer)local_410._0_8_)->field_0x6 = 'w';
    ((pointer)local_410._0_8_)->field_0x7 = 'e';
    ((pointer)local_410._0_8_)->m_value = (json_value)0x726f746365735f72;
    local_410._8_8_ = local_5d0._0_8_;
    (&((pointer)local_410._0_8_)->m_type)[local_5d0._0_8_] = null;
    pmVar3 = &world->_nodes;
    ppWVar25 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar3,(key_type *)local_410);
    pWVar7 = *ppWVar25;
    local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x1b;
    local_5d0._0_8_ = pFVar20;
    local_5d0._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0,
                    (size_type *)&local_560,0);
    local_5d0._16_8_ =
         local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->field_0xb = 0x72745f726f746365;
    builtin_strncpy((char *)((long)&((pointer)(local_5d0._0_8_ + 0x10))->_vptr_Flag + 3),"ee_coast",
                    8);
    ((pointer)local_5d0._0_8_)->_vptr_Flag = (_func_int **)0x65776f745f72696d;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->byte = 0x726f746365735f72;
    local_5d0._8_8_ =
         local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(char *)((long)&((pointer)local_5d0._0_8_)->_vptr_Flag +
             (long)local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                   super__Vector_impl_data._M_start) = '\0';
    ppWVar25 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar3,(key_type *)local_5d0);
    pWVar24 = RandomizerWorld::path(world,pWVar7,*ppWVar25);
    ppIVar37 = (pWVar24->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((pWVar24->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar37) {
      (pWVar24->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar37;
    }
    if ((pointer)local_5d0._0_8_ != pFVar20) {
      operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
    }
    if ((pointer)local_410._0_8_ != (pointer)auStack_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(auStack_400[7],
                               CONCAT16(auStack_400[6],CONCAT24(auStack_400._4_2_,auStack_400._0_4_)
                                       )) + 1);
    }
    local_5d0._0_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x10;
    local_410._0_8_ = (pointer)auStack_400;
    local_410._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410,
                    (size_type *)local_5d0,0);
    auStack_400._0_4_ = (undefined4)local_5d0._0_8_;
    auStack_400._4_2_ = SUB82(local_5d0._0_8_,4);
    auStack_400[6] = SUB81(local_5d0._0_8_,6);
    auStack_400[7] = SUB81(local_5d0._0_8_,7);
    ((mapped_type)local_410._0_8_)->_vptr_Item = (_func_int **)0x65776f745f72696d;
    ((mapped_type)local_410._0_8_)->_id = 'r';
    ((mapped_type)local_410._0_8_)->field_0x9 = '_';
    ((mapped_type)local_410._0_8_)->field_0xa = 's';
    ((mapped_type)local_410._0_8_)->field_0xb = 'e';
    ((mapped_type)local_410._0_8_)->field_0xc = 'c';
    ((mapped_type)local_410._0_8_)->field_0xd = 't';
    ((mapped_type)local_410._0_8_)->field_0xe = 'o';
    ((mapped_type)local_410._0_8_)->field_0xf = 'r';
    local_410._8_8_ = local_5d0._0_8_;
    *(char *)((long)&((mapped_type)local_410._0_8_)->_vptr_Item + local_5d0._0_8_) = '\0';
    ppWVar25 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar3,(key_type *)local_410);
    pWVar7 = *ppWVar25;
    local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x1b;
    local_5d0._0_8_ = pFVar20;
    local_5d0._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0,
                    (size_type *)&local_560,0);
    local_5d0._16_8_ =
         local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->field_0xb = 0x72745f726f746365;
    builtin_strncpy((char *)((long)&((pointer)(local_5d0._0_8_ + 0x10))->_vptr_Flag + 3),"ee_ledge",
                    8);
    ((pointer)local_5d0._0_8_)->_vptr_Flag = (_func_int **)0x65776f745f72696d;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->byte = 0x726f746365735f72;
    local_5d0._8_8_ =
         local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(char *)((long)&((pointer)local_5d0._0_8_)->_vptr_Flag +
             (long)local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                   super__Vector_impl_data._M_start) = '\0';
    ppWVar25 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar3,(key_type *)local_5d0);
    pWVar24 = RandomizerWorld::path(world,pWVar7,*ppWVar25);
    ppIVar37 = (pWVar24->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((pWVar24->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar37) {
      (pWVar24->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppIVar37;
    }
    if ((pointer)local_5d0._0_8_ != pFVar20) {
      operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
    }
    if ((mapped_type)local_410._0_8_ != (mapped_type)auStack_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(auStack_400[7],
                               CONCAT16(auStack_400[6],CONCAT24(auStack_400._4_2_,auStack_400._0_4_)
                                       )) + 1);
    }
  }
  if (options->_damage_boosting_in_logic == true) {
    ppWVar38 = (world->_paths).super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    local_490 = (world->_paths).super__Vector_base<WorldPath_*,_std::allocator<WorldPath_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (ppWVar38 != local_490) {
      do {
        pWVar24 = *ppWVar38;
        ppIVar37 = (pWVar24->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppIVar8 = (pWVar24->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        local_410[0] = 6;
        ppIVar17 = std::
                   map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                   ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                         *)world,local_410);
        local_410._0_8_ = *ppIVar17;
        _Var26 = std::
                 __find_if<__gnu_cxx::__normal_iterator<Item**,std::vector<Item*,std::allocator<Item*>>>,__gnu_cxx::__ops::_Iter_equals_val<Item*const>>
                           (ppIVar37,ppIVar8,local_410);
        ppIVar37 = (pWVar24->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppIVar32 = (pWVar24->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        if (_Var26._M_current != ppIVar32) {
          ppIVar2 = _Var26._M_current + 1;
          if (ppIVar2 != ppIVar32) {
            memmove(_Var26._M_current,ppIVar2,(long)ppIVar32 - (long)ppIVar2);
            ppIVar37 = (pWVar24->_required_items).
                       super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            ppIVar32 = (pWVar24->_required_items).
                       super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
          }
          ppIVar32 = ppIVar32 + -1;
          (pWVar24->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
          super__Vector_impl_data._M_finish = ppIVar32;
        }
        local_410[0] = 5;
        ppIVar17 = std::
                   map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                   ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                         *)world,local_410);
        local_410._0_8_ = *ppIVar17;
        _Var26 = std::
                 __find_if<__gnu_cxx::__normal_iterator<Item**,std::vector<Item*,std::allocator<Item*>>>,__gnu_cxx::__ops::_Iter_equals_val<Item*const>>
                           (ppIVar37,ppIVar32,local_410);
        ppIVar32 = (pWVar24->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        if (_Var26._M_current != ppIVar32) {
          ppIVar2 = _Var26._M_current + 1;
          if (ppIVar2 != ppIVar32) {
            memmove(_Var26._M_current,ppIVar2,(long)ppIVar32 - (long)ppIVar2);
            ppIVar32 = (pWVar24->_required_items).
                       super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                       super__Vector_impl_data._M_finish;
          }
          (pWVar24->_required_items).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
          super__Vector_impl_data._M_finish = ppIVar32 + -1;
        }
        ppWVar38 = ppWVar38 + 1;
      } while (ppWVar38 != local_490);
    }
  }
  pFVar20 = (pointer)(local_5d0 + 0x10);
  if (options->_allow_whistle_usage_behind_trees == true) {
    pWVar24 = (WorldPath *)operator_new(0x60);
    local_5d0._0_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x16;
    local_410._0_8_ = (pointer)auStack_400;
    local_410._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410,
                    (size_type *)local_5d0,0);
    auStack_400._0_4_ = (undefined4)local_5d0._0_8_;
    auStack_400._4_2_ = SUB82(local_5d0._0_8_,4);
    auStack_400[6] = SUB81(local_5d0._0_8_,6);
    auStack_400[7] = SUB81(local_5d0._0_8_,7);
    ((pointer)local_410._0_8_)->m_type = 'g';
    ((pointer)local_410._0_8_)->field_0x1 = 'r';
    ((pointer)local_410._0_8_)->field_0x2 = 'e';
    ((pointer)local_410._0_8_)->field_0x3 = 'e';
    ((pointer)local_410._0_8_)->field_0x4 = 'n';
    ((pointer)local_410._0_8_)->field_0x5 = 'm';
    ((pointer)local_410._0_8_)->field_0x6 = 'a';
    ((pointer)local_410._0_8_)->field_0x7 = 'z';
    ((pointer)local_410._0_8_)->m_value = (json_value)0x775f74736f705f65;
    *(undefined8 *)((long)&((pointer)local_410._0_8_)->m_value + 6) = 0x656c74736968775f;
    local_410._8_8_ = local_5d0._0_8_;
    (&((pointer)local_410._0_8_)->m_type)[local_5d0._0_8_] = null;
    ppWVar25 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(&world->_nodes,(key_type *)local_410);
    pWVar7 = *ppWVar25;
    local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x15;
    local_5d0._0_8_ = pFVar20;
    local_5d0._0_8_ =
         std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5d0,
                    (size_type *)&local_560,0);
    local_5d0._16_8_ =
         local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    ((pointer)local_5d0._0_8_)->_vptr_Flag = (_func_int **)0x7a616d6e65657267;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->byte = 0x68775f6572705f65;
    *(undefined8 *)&((pointer)local_5d0._0_8_)->field_0xd = 0x656c74736968775f;
    local_5d0._8_8_ =
         local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(char *)((long)&((pointer)local_5d0._0_8_)->_vptr_Flag +
             (long)local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                   super__Vector_impl_data._M_start) = '\0';
    ppWVar25 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(&world->_nodes,(key_type *)local_5d0);
    to_node = *ppWVar25;
    local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT71(local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,0x20);
    ppIVar17 = std::
               map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
               ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     *)world,(key_type_conflict *)&local_560);
    local_4a8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*ppIVar17;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_4a8;
    std::vector<Item_*,_std::allocator<Item_*>_>::vector
              (&local_560,__l_00,(allocator_type *)&local_4c8);
    local_448.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_448.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_448.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_468.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_468.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_468.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    WorldPath::WorldPath(pWVar24,pWVar7,to_node,1,&local_560,&local_448,&local_468);
    RandomizerWorld::add_path(world,pWVar24);
    if (local_468.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_468.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_468.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_468.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_448.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_448.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_448.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_448.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         *)local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
           super__Vector_impl_data._M_start !=
        (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
         *)0x0) {
      operator_delete(local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_560.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((pointer)local_5d0._0_8_ != pFVar20) {
      operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
    }
    if ((pointer)local_410._0_8_ != (pointer)auStack_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(auStack_400[7],
                               CONCAT16(auStack_400[6],CONCAT24(auStack_400._4_2_,auStack_400._0_4_)
                                       )) + 1);
    }
  }
  auStack_400._0_4_ = 0x676e696b;
  auStack_400._4_2_ = 0x6e5f;
  auStack_400[6] = 'o';
  auStack_400[7] = 'l';
  auStack_400._8_2_ = 0x5f65;
  auStack_400[10] = 99;
  auStack_400[0xb] = 0x61;
  auStack_400[0xc] = 0x76;
  auStack_400[0xd] = 0x65;
  local_410._8_8_ =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *)0xe;
  auStack_400[0xe] = 0;
  local_5d0._8_8_ =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *)0x6;
  local_5d0._16_7_ = 0x746c617a616b;
  local_5d0._0_8_ = pFVar20;
  local_410._0_8_ = (mapped_type)auStack_400;
  pWVar24 = RandomizerWorld::path(world,(string *)local_410,(string *)local_5d0);
  if ((pointer)local_5d0._0_8_ != pFVar20) {
    operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
  }
  if ((mapped_type)local_410._0_8_ != (mapped_type)auStack_400) {
    operator_delete((void *)local_410._0_8_,
                    CONCAT17(auStack_400[7],
                             CONCAT16(auStack_400[6],CONCAT24(auStack_400._4_2_,auStack_400._0_4_)))
                    + 1);
  }
  if (options->_jewel_count < 6) {
    if (options->_jewel_count != 0) {
      local_410[0] = 0x28;
      ppIVar17 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      local_410._0_8_ = *ppIVar17;
      this = &pWVar24->_required_items;
      std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                ((vector<Item*,std::allocator<Item*>> *)this,(Item **)local_410);
      if (1 < options->_jewel_count) {
        local_410[0] = 0x2a;
        ppIVar17 = std::
                   map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                   ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                         *)world,local_410);
        local_410._0_8_ = *ppIVar17;
        std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                  ((vector<Item*,std::allocator<Item*>> *)this,(Item **)local_410);
        if (2 < options->_jewel_count) {
          local_410[0] = 0x34;
          ppIVar17 = std::
                     map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                     ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                           *)world,local_410);
          local_410._0_8_ = *ppIVar17;
          std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                    ((vector<Item*,std::allocator<Item*>> *)this,(Item **)local_410);
          if (3 < options->_jewel_count) {
            local_410[0] = 0x21;
            ppIVar17 = std::
                       map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                             *)world,local_410);
            local_410._0_8_ = *ppIVar17;
            std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                      ((vector<Item*,std::allocator<Item*>> *)this,(Item **)local_410);
            if (4 < options->_jewel_count) {
              local_410[0] = 0x22;
              ppIVar17 = std::
                         map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                         ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                               *)world,local_410);
              local_410._0_8_ = *ppIVar17;
              std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                        ((vector<Item*,std::allocator<Item*>> *)this,(Item **)local_410);
            }
          }
        }
      }
    }
  }
  else {
    uVar33 = 0;
    do {
      local_410[0] = 0x28;
      ppIVar17 = std::
                 map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                 ::at((map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                       *)world,local_410);
      local_410._0_8_ = *ppIVar17;
      std::vector<Item*,std::allocator<Item*>>::emplace_back<Item*&>
                ((vector<Item*,std::allocator<Item*>> *)&pWVar24->_required_items,(Item **)local_410
                );
      uVar33 = uVar33 + 1;
    } while (uVar33 < options->_jewel_count);
  }
  RandomizerOptions::goal_abi_cxx11_((string *)local_410,options);
  iVar11 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                     ((string *)local_410,"reach_kazalt");
  if ((mapped_type)local_410._0_8_ != (mapped_type)auStack_400) {
    operator_delete((void *)local_410._0_8_,
                    CONCAT17(auStack_400[7],
                             CONCAT16(auStack_400[6],CONCAT24(auStack_400._4_2_,auStack_400._0_4_)))
                    + 1);
  }
  if (iVar11 == 0) {
    auStack_400._0_4_ = 0x646e65;
    local_410._8_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x3;
    pmVar3 = &world->_nodes;
    local_410._0_8_ = (mapped_type)auStack_400;
    ppWVar25 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar3,(key_type *)local_410);
    pWVar24->_to_node = *ppWVar25;
    if ((mapped_type)local_410._0_8_ != (mapped_type)auStack_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(auStack_400[7],
                               CONCAT16(auStack_400[6],CONCAT24(auStack_400._4_2_,auStack_400._0_4_)
                                       )) + 1);
    }
    pWVar24 = (WorldPath *)operator_new(0x60);
    auStack_400._0_4_ = 0x646e65;
    local_410._8_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x3;
    local_410._0_8_ = (mapped_type)auStack_400;
    ppWVar25 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar3,(key_type *)local_410);
    pWVar7 = *ppWVar25;
    local_5d0._0_8_ = local_5d0 + 0x10;
    local_5d0._8_8_ =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *)0x6;
    local_5d0._16_7_ = 0x746c617a616b;
    ppWVar25 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_WorldNode_*>_>_>
               ::at(pmVar3,(key_type *)local_5d0);
    local_4a8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_4a8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_4a8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_4c8.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4c8.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4c8.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_488.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_488.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_488.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    WorldPath::WorldPath(pWVar24,pWVar7,*ppWVar25,1,&local_4a8,&local_4c8,&local_488);
    RandomizerWorld::add_path(world,pWVar24);
    if (local_488.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_488.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_488.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_488.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_4c8.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4c8.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_4c8.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4c8.super__Vector_base<WorldNode_*,_std::allocator<WorldNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((mapped_type)
        local_4a8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
        super__Vector_impl_data._M_start != (mapped_type)0x0) {
      operator_delete(local_4a8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_4a8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_4a8.super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((pointer)local_5d0._0_8_ != (pointer)(local_5d0 + 0x10)) {
      operator_delete((void *)local_5d0._0_8_,(ulong)(local_5d0._16_8_ + 1));
    }
    if ((mapped_type)local_410._0_8_ != (mapped_type)auStack_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(auStack_400[7],
                               CONCAT16(auStack_400[6],CONCAT24(auStack_400._4_2_,auStack_400._0_4_)
                                       )) + 1);
    }
  }
  local_5d0._8_8_ =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *)0x0;
  local_5d0._16_8_ = (pointer)0x0;
  local_5d0._24_8_ = -0x8000000000000000;
  local_5d0._0_8_ = &options->_model_patch_spawns;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_begin((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)local_5d0);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::iteration_proxy_value
            ((iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_410,
             (iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)local_5d0);
  local_5f8._M_string_length = 0;
  local_5f8.field_2._M_allocated_capacity = 0;
  local_5f8.field_2._8_8_ = 0x8000000000000000;
  local_5f8._M_dataplus._M_p = (pointer)&options->_model_patch_spawns;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_end((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)&local_5f8);
  nlohmann::detail::
  iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::iteration_proxy_value
            ((iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)local_5d0,
             (iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)&local_5f8);
  while (bVar9 = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::
                 operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                           ((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)local_410,
                            (iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)local_5d0), !bVar9) {
    psVar12 = nlohmann::detail::
              iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::key((iteration_proxy_value<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                     *)local_410);
    pbVar13 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator*((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)local_410);
    cVar27 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>_>_>
             ::find(&(world->_available_spawn_locations)._M_t,psVar12);
    if ((_Rb_tree_header *)cVar27._M_node ==
        &(world->_available_spawn_locations)._M_t._M_impl.super__Rb_tree_header) {
      spawn = SpawnLocation::from_json(psVar12,pbVar13);
      RandomizerWorld::add_spawn_location(world,spawn);
    }
    else {
      ppSVar28 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SpawnLocation_*>_>_>
                 ::at(&world->_available_spawn_locations,psVar12);
      SpawnLocation::apply_json(*ppSVar28,pbVar13);
    }
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_410);
    local_3f0._M_p = local_3f0._M_p + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_p != &local_570) {
    operator_delete(local_580._M_p,local_570._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_p != &local_590) {
    operator_delete(local_5a0._M_p,local_590._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_p != &local_3b0) {
    operator_delete(local_3c0._M_p,local_3b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0[0] != &local_3d0) {
    operator_delete(local_3e0[0],local_3d0._M_allocated_capacity + 1);
  }
  lVar15 = 0;
  do {
    (world->_item_quantities)._M_elems[lVar15] =
         (ushort)(options->_items_distribution)._M_elems[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0x45);
  bVar10 = options->_jewel_count;
  if (bVar10 < 6) {
    if (bVar10 != 0) {
      if ((world->_item_quantities)._M_elems[0x28] == 0) {
        (world->_item_quantities)._M_elems[0x28] = 1;
      }
      if (bVar10 != 1) {
        if ((world->_item_quantities)._M_elems[0x2a] == 0) {
          (world->_item_quantities)._M_elems[0x2a] = 1;
        }
        if (2 < bVar10) {
          if ((world->_item_quantities)._M_elems[0x34] == 0) {
            (world->_item_quantities)._M_elems[0x34] = 1;
          }
          if (bVar10 != 3) {
            if ((world->_item_quantities)._M_elems[0x21] == 0) {
              (world->_item_quantities)._M_elems[0x21] = 1;
            }
            if ((bVar10 == 5) && ((world->_item_quantities)._M_elems[0x22] == 0)) {
              (world->_item_quantities)._M_elems[0x22] = 1;
            }
          }
        }
      }
    }
  }
  else if ((world->_item_quantities)._M_elems[0x28] < (ushort)bVar10) {
    (world->_item_quantities)._M_elems[0x28] = (ushort)bVar10;
    (world->_item_quantities)._M_elems[0x2a] = 0;
    (world->_item_quantities)._M_elems[0x34] = 0;
    (world->_item_quantities)._M_elems[0x21] = 0;
    (world->_item_quantities)._M_elems[0x22] = 0;
  }
  local_410._8_8_ =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *)0x0;
  auStack_400._0_4_ = 0;
  auStack_400._4_2_ = 0;
  auStack_400[6] = '\0';
  auStack_400[7] = '\0';
  auStack_400._8_2_ = 0;
  auStack_400[10] = 0;
  auStack_400[0xb] = 0;
  auStack_400[0xc] = 0;
  auStack_400[0xd] = 0;
  auStack_400[0xe] = 0;
  auStack_400[0xf] = 0x80;
  local_410._0_8_ = &options->_model_patch_hint_sources;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_begin((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)local_410);
  local_5d0._8_8_ =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *)0x0;
  local_5d0._16_8_ = (pointer)0x0;
  local_5d0._24_8_ = -0x8000000000000000;
  local_5d0._0_8_ = &options->_model_patch_hint_sources;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::set_end((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)local_5d0);
  bVar9 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::
          operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                    ((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)local_410,
                     (iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)local_5d0);
  if (!bVar9) {
    do {
      pbVar13 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)local_410);
      local_5f8._M_dataplus._M_p = (pointer)HintSource::from_json(pbVar13,&world->_nodes);
      std::vector<HintSource*,std::allocator<HintSource*>>::emplace_back<HintSource*&>
                ((vector<HintSource*,std::allocator<HintSource*>> *)&world->_hint_sources,
                 (HintSource **)&local_5f8);
      nlohmann::detail::
      iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator++((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)local_410);
      bVar9 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::
              operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                        ((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_410,
                         (iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)local_5d0);
    } while (!bVar9);
  }
  return;
}

Assistant:

void apply_randomizer_options(const RandomizerOptions& options, RandomizerWorld& world)
{
    world.starting_golds(options.starting_gold());
    world.starting_life(options.starting_life());

    patch_starting_flags(world, options);
    patch_items(world, options);
    patch_game_strings(world, options);

    apply_options_on_logic_paths(options, world);
    apply_options_on_spawn_locations(options, world);
    apply_options_on_item_distributions(options, world);
    apply_options_on_hint_sources(options, world);
}